

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int amqpvalue_get_received(AMQP_VALUE value,RECEIVED_HANDLE *received_handle)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE pAVar3;
  uint64_t local_50;
  uint64_t section_offset;
  AMQP_VALUE pAStack_40;
  uint32_t section_number;
  AMQP_VALUE item_value;
  AMQP_VALUE pAStack_30;
  uint32_t list_item_count;
  AMQP_VALUE list_value;
  RECEIVED_INSTANCE *received_instance;
  RECEIVED_HANDLE *ppRStack_18;
  int result;
  RECEIVED_HANDLE *received_handle_local;
  AMQP_VALUE value_local;
  
  ppRStack_18 = received_handle;
  received_handle_local = (RECEIVED_HANDLE *)value;
  list_value = (AMQP_VALUE)received_create_internal();
  *ppRStack_18 = (RECEIVED_HANDLE)list_value;
  if (*ppRStack_18 == (RECEIVED_HANDLE)0x0) {
    received_instance._4_4_ = 0x4353;
  }
  else {
    pAStack_30 = amqpvalue_get_inplace_described_value((AMQP_VALUE)received_handle_local);
    if (pAStack_30 == (AMQP_VALUE)0x0) {
      received_destroy(*ppRStack_18);
      received_instance._4_4_ = 0x435b;
    }
    else {
      iVar1 = amqpvalue_get_list_item_count(pAStack_30,(uint32_t *)((long)&item_value + 4));
      if (iVar1 == 0) {
        if (item_value._4_4_ == 0) {
          received_instance._4_4_ = 0x438f;
        }
        else {
          pAStack_40 = amqpvalue_get_list_item(pAStack_30,0);
          if (pAStack_40 == (AMQP_VALUE)0x0) {
            received_destroy(*ppRStack_18);
            received_instance._4_4_ = 0x4371;
          }
          else {
            AVar2 = amqpvalue_get_type(pAStack_40);
            if (AVar2 == AMQP_TYPE_NULL) {
              amqpvalue_destroy(pAStack_40);
              received_destroy(*ppRStack_18);
              received_instance._4_4_ = 0x437b;
            }
            else {
              iVar1 = amqpvalue_get_uint(pAStack_40,(uint32_t *)((long)&section_offset + 4));
              if (iVar1 == 0) {
                amqpvalue_destroy(pAStack_40);
                if (item_value._4_4_ < 2) {
                  received_instance._4_4_ = 0x43b8;
                }
                else {
                  pAStack_40 = amqpvalue_get_list_item(pAStack_30,1);
                  if (pAStack_40 == (AMQP_VALUE)0x0) {
                    received_destroy(*ppRStack_18);
                    received_instance._4_4_ = 0x439a;
                  }
                  else {
                    AVar2 = amqpvalue_get_type(pAStack_40);
                    if (AVar2 == AMQP_TYPE_NULL) {
                      amqpvalue_destroy(pAStack_40);
                      received_destroy(*ppRStack_18);
                      received_instance._4_4_ = 0x43a4;
                    }
                    else {
                      iVar1 = amqpvalue_get_ulong(pAStack_40,&local_50);
                      if (iVar1 == 0) {
                        amqpvalue_destroy(pAStack_40);
                        pAVar3 = amqpvalue_clone((AMQP_VALUE)received_handle_local);
                        *(AMQP_VALUE *)list_value = pAVar3;
                        received_instance._4_4_ = 0;
                      }
                      else {
                        amqpvalue_destroy(pAStack_40);
                        received_destroy(*ppRStack_18);
                        received_instance._4_4_ = 0x43ae;
                      }
                    }
                  }
                }
              }
              else {
                amqpvalue_destroy(pAStack_40);
                received_destroy(*ppRStack_18);
                received_instance._4_4_ = 0x4385;
              }
            }
          }
        }
      }
      else {
        received_instance._4_4_ = 0x4362;
      }
    }
  }
  return received_instance._4_4_;
}

Assistant:

int amqpvalue_get_received(AMQP_VALUE value, RECEIVED_HANDLE* received_handle)
{
    int result;
    RECEIVED_INSTANCE* received_instance = (RECEIVED_INSTANCE*)received_create_internal();
    *received_handle = received_instance;
    if (*received_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            received_destroy(*received_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {
                    AMQP_VALUE item_value;
                    /* section-number */
                    if (list_item_count > 0)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 0);
                        if (item_value == NULL)
                        {
                            {
                                received_destroy(*received_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                received_destroy(*received_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                uint32_t section_number;
                                if (amqpvalue_get_uint(item_value, &section_number) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    received_destroy(*received_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }
                    /* section-offset */
                    if (list_item_count > 1)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 1);
                        if (item_value == NULL)
                        {
                            {
                                received_destroy(*received_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                received_destroy(*received_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                uint64_t section_offset;
                                if (amqpvalue_get_ulong(item_value, &section_offset) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    received_destroy(*received_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }

                    received_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}